

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ExprNodePtr __thiscall punky::par::Parser::parse_call_expression(Parser *this,ExprNodePtr *function)

{
  optional<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>_>
  *in_RDX;
  OptCallArgs arguments;
  Token call_tok;
  pointer local_60;
  undefined1 local_58 [16];
  Token local_48;
  
  tok::Token::Token((Token *)(local_58 + 0x10),(Token *)(function + 6));
  parse_call_arguments((Parser *)local_58);
  std::
  make_unique<punky::ast::CallExpression,punky::tok::Token&,std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>,std::optional<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>,std::allocator<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>>>,std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>,std::allocator<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>>>>>>>
            ((Token *)&local_60,
             (unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_> *)
             (local_58 + 0x10),in_RDX);
  (this->m_lex).m_line._M_dataplus._M_p = local_60;
  std::
  _Optional_payload_base<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>_>
  ::_M_reset((_Optional_payload_base<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>_>
              *)local_58);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(local_58 + 0x18));
  return (__uniq_ptr_data<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>,_true,_true>
          )(__uniq_ptr_data<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>,_true,_true>
            )this;
}

Assistant:

auto Parser::parse_call_expression(ast::ExprNodePtr function) -> ast::ExprNodePtr
{
    auto call_tok  = m_curr_tok;
    auto arguments = parse_call_arguments();
    return std::make_unique<ast::CallExpression>(call_tok,
                                                 std::move(function), std::move(arguments));
}